

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void response_close_frame_written
               (cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  
  puVar4 = *(undefined8 **)((long)handler_context + 0x218);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    if (puVar4 == *(undefined8 **)((long)handler_context + 0x220)) {
      uVar5 = 0;
    }
    else {
      uVar5 = *puVar4;
    }
    *(undefined8 *)((long)handler_context + 0x218) = uVar5;
  }
  plVar1 = (long *)puVar4[1];
  plVar2 = (long *)*plVar1;
  if (plVar2 != (long *)0x0 && plVar2 != plVar1) {
    plVar1[2] = plVar1[2] + -1;
    plVar1[3] = plVar1[3] - plVar2[3];
    lVar3 = *plVar2;
    plVar1 = (long *)plVar2[1];
    *(long **)(lVar3 + 8) = plVar1;
    *plVar1 = lVar3;
  }
  puVar4[1] = 0;
  abort_write_jobs((cio_websocket *)handler_context);
  close((int)handler_context);
  return;
}

Assistant:

static void response_close_frame_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	(void)err;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	write_jobs_popfront(websocket);

	abort_write_jobs(websocket);
	close(websocket);
}